

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O2

void bng_properties(t_gobj *z,_glist *owner)

{
  iemgui_new_dialog(z,(t_iemgui *)z,"bang",
                    (float)(*(int *)((long)&z[4].g_pd + 4) /
                           *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4)),8.0,0.0,0.0,
                    (float)*(int *)((long)&z[0x49].g_pd + 4),(float)*(int *)&z[0x49].g_next,2,-1,"",
                    "",1,-1,-1);
  return;
}

Assistant:

static void bng_properties(t_gobj *z, t_glist *owner)
{
    t_bng *x = (t_bng *)z;
    iemgui_new_dialog(x, &x->x_gui, "bang",
                      x->x_gui.x_w/IEMGUI_ZOOM(x), IEM_GUI_MINSIZE,
                      0, 0,
                      x->x_flashtime_break, x->x_flashtime_hold,
                      2,
                      -1, "", "",
                      1, -1, -1);
}